

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcparam.c
# Opt level: O3

void jpeg_set_quality(j_compress_ptr cinfo,int quality,boolean force_baseline)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = 1;
  if (1 < quality) {
    uVar2 = quality;
  }
  uVar1 = 100;
  if ((int)uVar2 < 100) {
    uVar1 = uVar2;
  }
  if (quality < 0x32) {
    uVar2 = 5000 / (uVar1 & 0xffff);
  }
  else {
    uVar2 = uVar1 * -2 + 200;
  }
  jpeg_add_quant_table(cinfo,0,std_luminance_quant_tbl,uVar2,force_baseline);
  jpeg_add_quant_table(cinfo,1,std_chrominance_quant_tbl,uVar2,force_baseline);
  return;
}

Assistant:

GLOBAL(void)
jpeg_set_quality (j_compress_ptr cinfo, int quality, boolean force_baseline)
/* Set or change the 'quality' (quantization) setting, using default tables.
 * This is the standard quality-adjusting entry point for typical user
 * interfaces; only those who want detailed control over quantization tables
 * would use the preceding three routines directly.
 */
{
  /* Convert user 0-100 rating to percentage scaling */
  quality = jpeg_quality_scaling(quality);

  /* Set up standard quality tables */
  jpeg_set_linear_quality(cinfo, quality, force_baseline);
}